

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O3

bool cmMessageCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  undefined1 uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  LogLevel LVar8;
  long lVar9;
  string message;
  string local_160;
  cmMakefile *local_140;
  undefined1 local_138 [32];
  pointer local_118;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_118 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == local_118) {
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_160,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_140 = status->Makefile;
    iVar6 = std::__cxx11::string::compare((char *)pbVar2);
    iVar7 = 1;
    lVar9 = 0x20;
    if ((iVar6 != 0) &&
       (iVar6 = std::__cxx11::string::compare((char *)pbVar2), iVar7 = 1, iVar6 != 0)) {
      iVar6 = std::__cxx11::string::compare((char *)pbVar2);
      iVar7 = 2;
      if (iVar6 != 0) {
        iVar7 = std::__cxx11::string::compare((char *)pbVar2);
        if (iVar7 == 0) {
          paVar1 = &local_160.field_2;
          local_160._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_160,"CMAKE_SUPPRESS_DEVELOPER_ERRORS","");
          bVar4 = cmMakefile::IsSet(local_140,&local_160);
          if (bVar4) {
            local_138._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_138 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_138,"CMAKE_SUPPRESS_DEVELOPER_ERRORS","");
            bVar4 = cmMakefile::IsOn(local_140,(string *)local_138);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_138 + 0x10)) {
              operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
            }
            bVar4 = !bVar4;
          }
          else {
            bVar4 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != paVar1) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if (bVar4) {
            iVar7 = 1;
          }
          else {
            local_160._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_160,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
            bVar4 = cmMakefile::IsOn(local_140,&local_160);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar1) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            iVar7 = 2;
            if (bVar4) goto LAB_002ab6f3;
          }
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)pbVar2);
          if (((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)pbVar2), iVar7 == 0))
             || (iVar7 = std::__cxx11::string::compare((char *)pbVar2), iVar7 == 0)) {
            iVar7 = 4;
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)pbVar2);
            if (iVar7 == 0) {
              iVar7 = 4;
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)pbVar2);
              if (iVar7 == 0) {
                iVar7 = 5;
              }
              else {
                iVar7 = std::__cxx11::string::compare((char *)pbVar2);
                if (iVar7 == 0) {
                  iVar7 = 6;
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)pbVar2);
                  if (iVar7 == 0) {
                    iVar7 = 7;
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare((char *)pbVar2);
                    if (iVar7 == 0) {
                      paVar1 = &local_160.field_2;
                      local_160._M_dataplus._M_p = (pointer)paVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_160,"CMAKE_ERROR_DEPRECATED","");
                      bVar4 = cmMakefile::IsOn(local_140,&local_160);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_160._M_dataplus._M_p != paVar1) {
                        operator_delete(local_160._M_dataplus._M_p,
                                        local_160.field_2._M_allocated_capacity + 1);
                      }
                      if (bVar4) {
                        iVar7 = 1;
                      }
                      else {
                        local_160._M_dataplus._M_p = (pointer)paVar1;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_160,"CMAKE_WARN_DEPRECATED","");
                        bVar4 = cmMakefile::IsSet(local_140,&local_160);
                        bVar5 = true;
                        if (bVar4) {
                          local_138._0_8_ = local_138 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_138,"CMAKE_WARN_DEPRECATED","");
                          bVar5 = cmMakefile::IsOn(local_140,(string *)local_138);
                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_138._0_8_ !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_138 + 0x10)) {
                            operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
                          }
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_160._M_dataplus._M_p != paVar1) {
                          operator_delete(local_160._M_dataplus._M_p,
                                          local_160.field_2._M_allocated_capacity + 1);
                        }
                        if (bVar5 == false) goto LAB_002ab6f3;
                        iVar7 = 2;
                      }
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare((char *)pbVar2);
                      lVar9 = (ulong)(iVar7 == 0) << 5;
                      iVar7 = 3;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    LVar8 = cmMakefile::GetCurrentLogLevel(local_140);
    if (iVar7 <= (int)LVar8) {
      local_138._0_8_ = (long)&(pbVar2->_M_dataplus)._M_p + lVar9;
      local_138._8_8_ =
           (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      cmJoin(&local_160,(cmStringRange *)local_138,(string_view)(ZEXT816(0x806b49) << 0x40),
             (string_view)ZEXT816(0));
      uVar3 = (*(code *)(&DAT_007a4110 + *(int *)(&DAT_007a4110 + (ulong)(iVar7 - 1) * 4)))();
      return (bool)uVar3;
    }
  }
LAB_002ab6f3:
  return pbVar2 != local_118;
}

Assistant:

bool cmMessageCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  auto& mf = status.GetMakefile();

  auto i = args.cbegin();

  auto type = MessageType::MESSAGE;
  auto fatal = false;
  auto level = Message::LogLevel::LOG_UNDEFINED;
  auto checkingType = CheckingType::UNDEFINED;
  if (*i == "SEND_ERROR") {
    type = MessageType::FATAL_ERROR;
    level = Message::LogLevel::LOG_ERROR;
    ++i;
  } else if (*i == "FATAL_ERROR") {
    fatal = true;
    type = MessageType::FATAL_ERROR;
    level = Message::LogLevel::LOG_ERROR;
    ++i;
  } else if (*i == "WARNING") {
    type = MessageType::WARNING;
    level = Message::LogLevel::LOG_WARNING;
    ++i;
  } else if (*i == "AUTHOR_WARNING") {
    if (mf.IsSet("CMAKE_SUPPRESS_DEVELOPER_ERRORS") &&
        !mf.IsOn("CMAKE_SUPPRESS_DEVELOPER_ERRORS")) {
      fatal = true;
      type = MessageType::AUTHOR_ERROR;
      level = Message::LogLevel::LOG_ERROR;
    } else if (!mf.IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
      type = MessageType::AUTHOR_WARNING;
      level = Message::LogLevel::LOG_WARNING;
    } else {
      return true;
    }
    ++i;
  } else if (*i == "CHECK_START") {
    level = Message::LogLevel::LOG_STATUS;
    checkingType = CheckingType::CHECK_START;
    ++i;
  } else if (*i == "CHECK_PASS") {
    level = Message::LogLevel::LOG_STATUS;
    checkingType = CheckingType::CHECK_PASS;
    ++i;
  } else if (*i == "CHECK_FAIL") {
    level = Message::LogLevel::LOG_STATUS;
    checkingType = CheckingType::CHECK_FAIL;
    ++i;
  } else if (*i == "STATUS") {
    level = Message::LogLevel::LOG_STATUS;
    ++i;
  } else if (*i == "VERBOSE") {
    level = Message::LogLevel::LOG_VERBOSE;
    ++i;
  } else if (*i == "DEBUG") {
    level = Message::LogLevel::LOG_DEBUG;
    ++i;
  } else if (*i == "TRACE") {
    level = Message::LogLevel::LOG_TRACE;
    ++i;
  } else if (*i == "DEPRECATION") {
    if (mf.IsOn("CMAKE_ERROR_DEPRECATED")) {
      fatal = true;
      type = MessageType::DEPRECATION_ERROR;
      level = Message::LogLevel::LOG_ERROR;
    } else if (!mf.IsSet("CMAKE_WARN_DEPRECATED") ||
               mf.IsOn("CMAKE_WARN_DEPRECATED")) {
      type = MessageType::DEPRECATION_WARNING;
      level = Message::LogLevel::LOG_WARNING;
    } else {
      return true;
    }
    ++i;
  } else if (*i == "NOTICE") {
    // `NOTICE` message type is going to be output to stderr
    level = Message::LogLevel::LOG_NOTICE;
    ++i;
  } else {
    // Messages w/o any type are `NOTICE`s
    level = Message::LogLevel::LOG_NOTICE;
  }
  assert("Message log level expected to be set" &&
         level != Message::LogLevel::LOG_UNDEFINED);

  Message::LogLevel desiredLevel = mf.GetCurrentLogLevel();

  if (desiredLevel < level) {
    // Suppress the message
    return true;
  }

  auto message = cmJoin(cmMakeRange(i, args.cend()), "");

  switch (level) {
    case Message::LogLevel::LOG_ERROR:
    case Message::LogLevel::LOG_WARNING:
      // we've overridden the message type, above, so display it directly
      mf.GetMessenger()->DisplayMessage(type, message, mf.GetBacktrace());
      break;

    case Message::LogLevel::LOG_NOTICE:
      cmSystemTools::Message(IndentText(message, mf));
      break;

    case Message::LogLevel::LOG_STATUS:
      switch (checkingType) {
        case CheckingType::CHECK_START:
          mf.DisplayStatus(IndentText(message, mf), -1);
          mf.GetCMakeInstance()->PushCheckInProgressMessage(message);
          break;

        case CheckingType::CHECK_PASS:
          ReportCheckResult("CHECK_PASS"_s, message, mf);
          break;

        case CheckingType::CHECK_FAIL:
          ReportCheckResult("CHECK_FAIL"_s, message, mf);
          break;

        default:
          mf.DisplayStatus(IndentText(message, mf), -1);
          break;
      }
      break;

    case Message::LogLevel::LOG_VERBOSE:
    case Message::LogLevel::LOG_DEBUG:
    case Message::LogLevel::LOG_TRACE:
      mf.DisplayStatus(IndentText(message, mf), -1);
      break;

    default:
      assert("Unexpected log level! Review the `cmMessageCommand.cxx`." &&
             false);
      break;
  }

  if (fatal) {
    cmSystemTools::SetFatalErrorOccurred();
  }
  return true;
}